

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

FragmentOutputLayout *
vkt::shaderexecutor::anon_unknown_0::computeFragmentOutputLayout
          (FragmentOutputLayout *__return_storage_ptr__,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols
          )

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  InternalError *this;
  pointer item;
  int location;
  pointer local_38;
  
  (__return_storage_ptr__->locationSymbols).
  super__Vector_base<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->locationSymbols).
  super__Vector_base<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->locationSymbols).
  super__Vector_base<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  location = 0;
  item = (symbols->
         super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
         )._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (item == (symbols->
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    iVar3 = glu::getDataTypeNumLocations((item->varType).m_data.basic.type);
    bVar2 = de::
            contains<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                      (&__return_storage_ptr__->locationMap,&item->name);
    if (bVar2) break;
    de::
    insert<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
              (&__return_storage_ptr__->locationMap,&item->name,&location);
    location = location + iVar3;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    while (bVar2 = iVar3 != 0, iVar3 = iVar3 + -1, bVar2) {
      local_38 = item;
      std::
      vector<vkt::shaderexecutor::Symbol_const*,std::allocator<vkt::shaderexecutor::Symbol_const*>>
      ::emplace_back<vkt::shaderexecutor::Symbol_const*>
                ((vector<vkt::shaderexecutor::Symbol_const*,std::allocator<vkt::shaderexecutor::Symbol_const*>>
                  *)__return_storage_ptr__,&local_38);
    }
    item = item + 1;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this,(char *)0x0,"!de::contains(ret.locationMap, it->name)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
             ,0x1e2);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static FragmentOutputLayout computeFragmentOutputLayout (const std::vector<Symbol>& symbols)
{
	FragmentOutputLayout	ret;
	int						location	= 0;

	for (std::vector<Symbol>::const_iterator it = symbols.begin(); it != symbols.end(); ++it)
	{
		const int	numLocations	= glu::getDataTypeNumLocations(it->varType.getBasicType());

		TCU_CHECK_INTERNAL(!de::contains(ret.locationMap, it->name));
		de::insert(ret.locationMap, it->name, location);
		location += numLocations;

		for (int ndx = 0; ndx < numLocations; ++ndx)
			ret.locationSymbols.push_back(&*it);
	}

	return ret;
}